

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

AST_NodePtr __thiscall
chaiscript::ChaiScript_Basic::parse(ChaiScript_Basic *this,string *t_input,bool t_debug_print)

{
  undefined8 uVar1;
  pointer pCVar2;
  type pAVar3;
  byte in_CL;
  undefined7 in_register_00000011;
  allocator<char> local_81;
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [38];
  undefined1 local_22;
  byte local_21;
  undefined8 uStack_20;
  bool t_debug_print_local;
  string *t_input_local;
  ChaiScript_Basic *this_local;
  AST_NodePtr *ast;
  
  uStack_20 = CONCAT71(in_register_00000011,t_debug_print);
  local_21 = in_CL & 1;
  local_22 = 0;
  t_input_local = t_input;
  this_local = this;
  pCVar2 = std::
           unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
           ::operator->((unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
                         *)&t_input[9]._M_string_length);
  uVar1 = uStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"PARSE",&local_49);
  (**pCVar2->_vptr_ChaiScript_Parser_Base)(this,pCVar2,uVar1,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  if ((local_21 & 1) != 0) {
    pCVar2 = std::
             unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
             ::operator->((unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
                           *)&t_input[9]._M_string_length);
    pAVar3 = std::unique_ptr<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_>::
             operator*((unique_ptr<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_>
                        *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_80,"",&local_81);
    (*pCVar2->_vptr_ChaiScript_Parser_Base[1])(pCVar2,pAVar3,local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return (__uniq_ptr_data<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>,_true,_true>
          )(__uniq_ptr_data<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>,_true,_true>
            )this;
}

Assistant:

AST_NodePtr parse(const std::string &t_input, const bool t_debug_print = false) {
      auto ast = m_parser->parse(t_input, "PARSE");
      if (t_debug_print) {
        m_parser->debug_print(*ast);
      }
      return ast;
    }